

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_PartiteGraph.cpp
# Opt level: O0

void __thiscall
PartiteGraphTest_test_add_edge_Test::~PartiteGraphTest_test_add_edge_Test
          (PartiteGraphTest_test_add_edge_Test *this)

{
  PartiteGraphTest_test_add_edge_Test *this_local;
  
  ~PartiteGraphTest_test_add_edge_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(PartiteGraphTest, test_add_edge) {
    std::unordered_set<int> expected{2};
    graph::PartiteGraph<int, Vertex, Edge> graph;

    EXPECT_THROW(graph.add_edge(0, 1), std::runtime_error);
    graph.add_vertex<vertex_partition>(0, {"vertex 0"});
    graph.add_vertex<vertex_partition>(1, {"vertex 1"});
    EXPECT_THROW(graph.add_edge(0, 1), std::runtime_error);
    graph.add_vertex<edge_partition>(2, {0.5});
    graph.add_edge(0, 2);
    graph.add_edge(2, 1);
    EXPECT_EQ(graph.get_children(0), expected);
    EXPECT_EQ(graph.get_parents(1), expected);
}